

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_font_multiline.cpp
# Opt level: O2

bool draw_custom_multiline_cb(int line_num,char *line,int size,void *extra)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ALLEGRO_USTR_INFO info;
  undefined1 local_30 [16];
  
  dVar6 = fmod((double)*(int *)((long)extra + 0x10) + ((double)line_num * 360.0) / 5.0,360.0);
  uVar8 = 0x3f800000;
  uVar7 = al_color_hsv((float)dVar6,0x3f800000,0x3f800000);
  fVar1 = *(float *)((long)extra + 8);
  dVar6 = sin((double)*(int *)((long)extra + 0x10) * 0.05 + (double)line_num);
  fVar2 = *(float *)((long)extra + 0x14);
  fVar3 = *(float *)((long)extra + 0xc);
  uVar4 = *extra;
  uVar5 = al_ref_buffer(local_30,line,(long)size);
  al_draw_ustr(uVar7,uVar8,(float)(dVar6 * 10.0 + (double)(fVar1 + 10.0)),
               (float)line_num * fVar2 + fVar3,uVar4,0,uVar5);
  return line_num < 5;
}

Assistant:

static bool draw_custom_multiline_cb(int line_num, const char *line, int size,
   void *extra) {
   DRAW_CUSTOM_LINE_EXTRA *s = (DRAW_CUSTOM_LINE_EXTRA *) extra;
   float x, y;
   ALLEGRO_USTR_INFO info;
   ALLEGRO_COLOR c =
      al_color_hsv(fmod(360.0 * (float)line_num / 5.0 + s->tick, 360.0),
                   1.0, 1.0);
   x  = s->x + 10 + sin(line_num + s->tick * 0.05) * 10;
   y  = s->y + (s->line_height * line_num);
   al_draw_ustr(s->font, c, x, y, 0, al_ref_buffer(&info, line, size));
   return (line_num < 5);
}